

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse_tag_contents(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *this,bool is_unescaped_var,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *contents,
                  mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *tag)

{
  char cVar1;
  tag_type tVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000031,is_unescaped_var) != 0) {
    tag->type = unescaped_variable;
LAB_001e6710:
    std::__cxx11::string::_M_assign((string *)tag);
    return;
  }
  if (contents->_M_string_length == 0) {
    tag->type = variable;
    (tag->name)._M_string_length = 0;
    *(tag->name)._M_dataplus._M_p = '\0';
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)contents);
    cVar1 = *pcVar3;
    if (cVar1 == '!') {
      tVar2 = comment;
    }
    else if (cVar1 == '#') {
      tVar2 = section_begin;
    }
    else if (cVar1 == '&') {
      tVar2 = unescaped_variable;
    }
    else if (cVar1 == '/') {
      tVar2 = section_end;
    }
    else if (cVar1 == '>') {
      tVar2 = partial;
    }
    else {
      if (cVar1 != '^') {
        tag->type = variable;
        goto LAB_001e6710;
      }
      tVar2 = section_begin_inverted;
    }
    tag->type = tVar2;
    std::__cxx11::string::string((string *)&name,(string *)contents);
    std::__cxx11::string::erase(&name,name._M_dataplus._M_p);
    trim<std::__cxx11::string>(&local_38,(mustache *)&name,s);
    std::__cxx11::string::operator=((string *)tag,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void parse_tag_contents(bool is_unescaped_var, const string_type& contents, mstch_tag<string_type>& tag) const {
        if (is_unescaped_var) {
            tag.type = tag_type::unescaped_variable;
            tag.name = contents;
        } else if (contents.empty()) {
            tag.type = tag_type::variable;
            tag.name.clear();
        } else {
            switch (contents.at(0)) {
                case '#':
                    tag.type = tag_type::section_begin;
                    break;
                case '^':
                    tag.type = tag_type::section_begin_inverted;
                    break;
                case '/':
                    tag.type = tag_type::section_end;
                    break;
                case '>':
                    tag.type = tag_type::partial;
                    break;
                case '&':
                    tag.type = tag_type::unescaped_variable;
                    break;
                case '!':
                    tag.type = tag_type::comment;
                    break;
                default:
                    tag.type = tag_type::variable;
                    break;
            }
            if (tag.type == tag_type::variable) {
                tag.name = contents;
            } else {
                string_type name{contents};
                name.erase(name.begin());
                tag.name = trim(name);
            }
        }
    }